

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadBinaryFile(COBImporter *this,Scene *out,StreamReaderLE *reader)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string type;
  ChunkInfo local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (reader == (StreamReaderLE *)0x0) {
    return;
  }
  do {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    StreamReader<false,_false>::Get<signed_char>(reader);
    cVar6 = (char)&local_50;
    std::__cxx11::string::push_back(cVar6);
    StreamReader<false,_false>::Get<signed_char>(reader);
    std::__cxx11::string::push_back(cVar6);
    StreamReader<false,_false>::Get<signed_char>(reader);
    std::__cxx11::string::push_back(cVar6);
    StreamReader<false,_false>::Get<signed_char>(reader);
    std::__cxx11::string::push_back(cVar6);
    local_68.id = 0;
    local_68.parent_id = 0;
    local_68.version = 0;
    local_68.size = 0xffffffff;
    sVar2 = StreamReader<false,_false>::Get<short>(reader);
    local_68.version = sVar2 * 10;
    sVar2 = StreamReader<false,_false>::Get<short>(reader);
    local_68.version = local_68.version + (int)sVar2;
    uVar3 = StreamReader<false,_false>::Get<int>(reader);
    local_68.id = uVar3;
    uVar3 = StreamReader<false,_false>::Get<int>(reader);
    local_68.parent_id = uVar3;
    iVar4 = StreamReader<false,_false>::Get<int>(reader);
    local_68.size = iVar4;
    pbVar7 = &local_50;
    bVar1 = std::operator==(&local_50,"PolH");
    if (bVar1) {
      ReadPolH_Binary((COBImporter *)pbVar7,out,reader,&local_68);
    }
    else {
      pcVar5 = "BitM";
      pbVar7 = &local_50;
      bVar1 = std::operator==(&local_50,"BitM");
      if (bVar1) {
        ReadBitM_Binary((COBImporter *)pbVar7,(Scene *)pcVar5,reader,&local_68);
      }
      else {
        pbVar7 = &local_50;
        bVar1 = std::operator==(&local_50,"Grou");
        if (bVar1) {
          ReadGrou_Binary((COBImporter *)pbVar7,out,reader,&local_68);
        }
        else {
          pbVar7 = &local_50;
          bVar1 = std::operator==(&local_50,"Lght");
          if (bVar1) {
            ReadLght_Binary((COBImporter *)pbVar7,out,reader,&local_68);
          }
          else {
            pbVar7 = &local_50;
            bVar1 = std::operator==(&local_50,"Came");
            if (bVar1) {
              ReadCame_Binary((COBImporter *)pbVar7,out,reader,&local_68);
            }
            else {
              pbVar7 = &local_50;
              bVar1 = std::operator==(&local_50,"Mat1");
              if (bVar1) {
                ReadMat1_Binary((COBImporter *)pbVar7,out,reader,&local_68);
              }
              else {
                pbVar7 = &local_50;
                bVar1 = std::operator==(&local_50,"Unit");
                if (bVar1) {
                  ReadUnit_Binary((COBImporter *)pbVar7,out,reader,&local_68);
                }
                else {
                  pbVar7 = &local_50;
                  bVar1 = std::operator==(&local_50,"OLay");
                  if (bVar1) {
                    if ((ulong)local_68._8_8_ >> 0x20 == 0xffffffff) {
                      UnsupportedChunk_Binary
                                ((COBImporter *)pbVar7,reader,&local_68,local_50._M_dataplus._M_p);
LAB_003fc38c:
                      std::__cxx11::string::~string((string *)&local_50);
                      return;
                    }
                    StreamReader<false,_false>::IncPtr(reader,(ulong)local_68._8_8_ >> 0x20);
                  }
                  else {
                    pbVar7 = &local_50;
                    bVar1 = std::operator==(&local_50,"END ");
                    if (bVar1) goto LAB_003fc38c;
                    UnsupportedChunk_Binary
                              ((COBImporter *)pbVar7,reader,&local_68,local_50._M_dataplus._M_p);
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

void COBImporter::ReadBinaryFile(Scene& out, StreamReaderLE* reader) {
    if (nullptr == reader) {
        return;
    }

    while(1) {
        std::string type;
         type += reader -> GetI1()
        ,type += reader -> GetI1()
        ,type += reader -> GetI1()
        ,type += reader -> GetI1()
        ;

        ChunkInfo nfo;
        nfo.version  = reader -> GetI2()*10;
        nfo.version += reader -> GetI2();

        nfo.id = reader->GetI4();
        nfo.parent_id = reader->GetI4();
        nfo.size = reader->GetI4();

        if (type == "PolH") {
            ReadPolH_Binary(out,*reader,nfo);
        }
        else if (type == "BitM") {
            ReadBitM_Binary(out,*reader,nfo);
        }
        else if (type == "Grou") {
            ReadGrou_Binary(out,*reader,nfo);
        }
        else if (type == "Lght") {
            ReadLght_Binary(out,*reader,nfo);
        }
        else if (type == "Came") {
            ReadCame_Binary(out,*reader,nfo);
        }
        else if (type == "Mat1") {
            ReadMat1_Binary(out,*reader,nfo);
        }
    /*  else if (type == "Bone") {
            ReadBone_Binary(out,*reader,nfo);
        }
        else if (type == "Chan") {
            ReadChan_Binary(out,*reader,nfo);
        }*/
        else if (type == "Unit") {
            ReadUnit_Binary(out,*reader,nfo);
        }
        else if (type == "OLay") {
            // ignore layer index silently.
            if(nfo.size != static_cast<unsigned int>(-1) ) {
                reader->IncPtr(nfo.size);
            }
            else return UnsupportedChunk_Binary(*reader,nfo,type.c_str());
        }
        else if (type == "END ") {
            return;
        }
        else UnsupportedChunk_Binary(*reader,nfo,type.c_str());
    }
}